

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createConstants.cpp
# Opt level: O0

void createConstantsForOperands(User *ins,Program *program)

{
  bool bVar1;
  Use *pUVar2;
  Program *this;
  ret_type value;
  ret_type pCVar3;
  Expr *pEVar4;
  Value *value_00;
  Program *in_RSI;
  ret_type C;
  User *user;
  Use *op;
  Use *__end1;
  Use *__begin1;
  const_op_range *__range1;
  Program *in_stack_00000710;
  Value *in_stack_00000718;
  Program *in_stack_ffffffffffffff90;
  Program *expr;
  Use *local_30;
  const_op_range local_28;
  Program *program_00;
  Program *pPVar5;
  
  local_28 = llvm::User::operands((User *)in_stack_ffffffffffffff90);
  program_00 = (Program *)&local_28;
  local_30 = llvm::iterator_range<const_llvm::Use_*>::begin
                       ((iterator_range<const_llvm::Use_*> *)program_00);
  pUVar2 = llvm::iterator_range<const_llvm::Use_*>::end
                     ((iterator_range<const_llvm::Use_*> *)program_00);
  for (; local_30 != pUVar2; local_30 = local_30 + 0x20) {
    this = (Program *)llvm::Use::get(local_30);
    bVar1 = llvm::isa<llvm::GlobalVariable,llvm::Value*>((Value **)0x26c64d);
    pPVar5 = in_RSI;
    if (!bVar1) {
      llvm::Use::get(local_30);
      value = llvm::dyn_cast_or_null<llvm::User,llvm::Value>((Value *)in_stack_ffffffffffffff90);
      if ((value != (ret_type)0x0) &&
         (bVar1 = llvm::isa<llvm::Instruction,llvm::User*>((User **)0x26c681), !bVar1)) {
        createConstantsForOperands((User *)in_RSI,program_00);
      }
      llvm::Use::get(local_30);
      pCVar3 = llvm::dyn_cast_or_null<llvm::Constant,llvm::Value>
                         ((Value *)in_stack_ffffffffffffff90);
      pPVar5 = in_RSI;
      if (pCVar3 != (ret_type)0x0) {
        expr = in_RSI;
        llvm::Use::get(local_30);
        pEVar4 = Program::getExpr(this,(Value *)value);
        pPVar5 = expr;
        if (pEVar4 == (Expr *)0x0) {
          value_00 = llvm::Use::get(local_30);
          createConstantValue(in_stack_00000718,in_stack_00000710);
          Program::addExpr(in_RSI,value_00,(Expr *)expr);
          in_stack_ffffffffffffff90 = expr;
        }
      }
    }
    in_RSI = pPVar5;
  }
  return;
}

Assistant:

static void createConstantsForOperands(const llvm::User* ins, Program& program) {
    for (const auto& op : ins->operands()) {

        // assumption: the GV that is an operand of this has already been initialized
        // reason: pass ComputeGlobalVarsOrder has been completed
        if (llvm::isa<llvm::GlobalVariable>(op.get()))
            continue;

        if (auto *user = llvm::dyn_cast_or_null<llvm::User>(op.get())) {
            if (!llvm::isa<llvm::Instruction>(user))
                createConstantsForOperands(user, program);
        }

        if (auto C = llvm::dyn_cast_or_null<llvm::Constant>(op.get())) {
            if (program.getExpr(op.get()) == nullptr)
                program.addExpr(op.get(), createConstantValue(C, program));
        }

    }
}